

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketInitiator.cpp
# Opt level: O3

void __thiscall
FIX::SocketInitiator::onDisconnect(SocketInitiator *this,SocketConnector *param_1,socket_handle s)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  Session *this_00;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_FIX::SocketConnection_*>_>,_std::_Rb_tree_iterator<std::pair<const_int,_FIX::SocketConnection_*>_>_>
  pVar7;
  socket_handle local_2c;
  
  p_Var5 = (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &(this->m_connections)._M_t._M_impl.super__Rb_tree_header;
  p_Var3 = &p_Var1->_M_header;
  p_Var4 = &p_Var1->_M_header;
  if (p_Var5 != (_Base_ptr)0x0) {
    do {
      if (s <= (int)p_Var5[1]._M_color) {
        p_Var4 = p_Var5;
      }
      p_Var5 = (&p_Var5->_M_left)[(int)p_Var5[1]._M_color < s];
    } while (p_Var5 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var4 != p_Var1) && (p_Var3 = p_Var4, s < (int)p_Var4[1]._M_color)) {
      p_Var3 = &p_Var1->_M_header;
    }
  }
  p_Var5 = (this->m_pendingConnections)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var2 = &(this->m_pendingConnections)._M_t._M_impl.super__Rb_tree_header;
  p_Var4 = &p_Var2->_M_header;
  p_Var6 = &p_Var2->_M_header;
  if (p_Var5 != (_Base_ptr)0x0) {
    do {
      if (s <= (int)p_Var5[1]._M_color) {
        p_Var4 = p_Var5;
      }
      p_Var5 = (&p_Var5->_M_left)[(int)p_Var5[1]._M_color < s];
    } while (p_Var5 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var4 != p_Var2) && (p_Var6 = p_Var4, s < (int)p_Var4[1]._M_color)) {
      p_Var6 = &p_Var2->_M_header;
    }
  }
  if ((_Rb_tree_header *)p_Var3 == p_Var1) {
    p_Var5 = (_Base_ptr)0x0;
  }
  else {
    p_Var5 = p_Var3[1]._M_parent;
  }
  if ((_Rb_tree_header *)p_Var6 != p_Var2) {
    p_Var5 = p_Var6[1]._M_parent;
  }
  if (p_Var5 != (_Base_ptr)0x0) {
    local_2c = s;
    Initiator::setDisconnected
              (&this->super_Initiator,(SessionID *)&p_Var5[0x105]._M_right[1]._M_left);
    this_00 = (Session *)p_Var5[0x105]._M_right;
    if (this_00 != (Session *)0x0) {
      Session::disconnect(this_00);
      Initiator::setDisconnected(&this->super_Initiator,&this_00->m_sessionID);
    }
    (**(code **)(*(long *)p_Var5 + 8))(p_Var5);
    pVar7 = std::
            _Rb_tree<int,_std::pair<const_int,_FIX::SocketConnection_*>,_std::_Select1st<std::pair<const_int,_FIX::SocketConnection_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketConnection_*>_>_>
            ::equal_range(&(this->m_connections)._M_t,&local_2c);
    std::
    _Rb_tree<int,_std::pair<const_int,_FIX::SocketConnection_*>,_std::_Select1st<std::pair<const_int,_FIX::SocketConnection_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketConnection_*>_>_>
    ::_M_erase_aux(&(this->m_connections)._M_t,(_Base_ptr)pVar7.first._M_node,
                   (_Base_ptr)pVar7.second._M_node);
    pVar7 = std::
            _Rb_tree<int,_std::pair<const_int,_FIX::SocketConnection_*>,_std::_Select1st<std::pair<const_int,_FIX::SocketConnection_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketConnection_*>_>_>
            ::equal_range(&(this->m_pendingConnections)._M_t,&local_2c);
    std::
    _Rb_tree<int,_std::pair<const_int,_FIX::SocketConnection_*>,_std::_Select1st<std::pair<const_int,_FIX::SocketConnection_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketConnection_*>_>_>
    ::_M_erase_aux(&(this->m_pendingConnections)._M_t,(_Base_ptr)pVar7.first._M_node,
                   (_Base_ptr)pVar7.second._M_node);
  }
  return;
}

Assistant:

void SocketInitiator::onDisconnect(SocketConnector &, socket_handle s) {
  SocketConnections::iterator i = m_connections.find(s);
  SocketConnections::iterator j = m_pendingConnections.find(s);

  SocketConnection *pSocketConnection = 0;
  if (i != m_connections.end()) {
    pSocketConnection = i->second;
  }
  if (j != m_pendingConnections.end()) {
    pSocketConnection = j->second;
  }
  if (!pSocketConnection) {
    return;
  }

  setDisconnected(pSocketConnection->getSession()->getSessionID());

  Session *pSession = pSocketConnection->getSession();
  if (pSession) {
    pSession->disconnect();
    setDisconnected(pSession->getSessionID());
  }

  delete pSocketConnection;
  m_connections.erase(s);
  m_pendingConnections.erase(s);
}